

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

bool ON_ValidateMeshNgonUserData(ON_V4V5_MeshNgonUserData *ngud,ON_Mesh *mesh)

{
  int *piVar1;
  ON_V4V5_MeshNgonList *pOVar2;
  ON_V4V5_MeshNgon *pOVar3;
  int iVar4;
  int in_EDX;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  iVar6 = (int)mesh;
  pOVar2 = ngud->m_ngon_list;
  if (pOVar2 == (ON_V4V5_MeshNgonList *)0x0) {
LAB_00526714:
    bVar10 = false;
  }
  else {
    iVar4 = ngud->m_mesh_V_count;
    if (iVar4 == 0 && ngud->m_mesh_F_count == 0) {
      ngud->m_mesh_F_count = -1;
      ngud->m_mesh_V_count = -1;
      if (0 < (long)pOVar2->m_ngons_count) {
        pOVar3 = pOVar2->m_ngons;
        if (pOVar3 != (ON_V4V5_MeshNgon *)0x0) {
          lVar7 = 0;
LAB_00526693:
          uVar8 = (ulong)(uint)pOVar3[lVar7].N;
          if (-1 < pOVar3[lVar7].N) {
            if (uVar8 != 0) {
              uVar5 = 1;
              uVar9 = 0;
              do {
                iVar4 = pOVar3[lVar7].vi[uVar9];
                if (iVar4 < 0) {
                  return false;
                }
                if (iVar6 <= iVar4) {
                  return false;
                }
                iVar4 = pOVar3[lVar7].fi[uVar9];
                if ((iVar4 < 0) || (in_EDX <= iVar4)) {
                  if (iVar4 == -1) goto LAB_005266ed;
                  goto LAB_00526714;
                }
                uVar9 = uVar9 + 1;
                uVar5 = uVar5 + 1;
              } while (uVar8 != uVar9);
            }
            goto LAB_005266de;
          }
        }
        goto LAB_00526714;
      }
LAB_00526718:
      ngud->m_mesh_V_count = iVar6;
      ngud->m_mesh_F_count = in_EDX;
      iVar4 = iVar6;
    }
    else if (ngud->m_mesh_F_count != in_EDX) goto LAB_00526714;
    bVar10 = iVar4 == iVar6;
  }
  return bVar10;
LAB_005266ed:
  while (uVar5 < uVar8) {
    iVar4 = pOVar3[lVar7].vi[uVar5];
    if (iVar4 < 0) {
      return false;
    }
    if (iVar6 <= iVar4) {
      return false;
    }
    piVar1 = pOVar3[lVar7].fi + uVar5;
    uVar5 = uVar5 + 1;
    if (*piVar1 != -1) {
      return false;
    }
  }
LAB_005266de:
  lVar7 = lVar7 + 1;
  if (lVar7 == pOVar2->m_ngons_count) goto LAB_00526718;
  goto LAB_00526693;
}

Assistant:

static 
bool ON_ValidateMeshNgonUserData(
  ON_V4V5_MeshNgonUserData* ngud,
  const ON_Mesh& mesh
  )
{
  int i;
  if ( 0 == ngud || 0 == ngud->m_ngon_list )
    return false;

  const int mesh_V_count = mesh.m_V.Count();
  const int mesh_F_count = mesh.m_F.Count();

  if ( 0 == ngud->m_mesh_V_count && 0 == ngud->m_mesh_F_count )
  {
    // This is old user data that did not have validation counts
    // saved in the file.

    // Set validation counts to -1 so we never do this slow validation again.
    ngud->m_mesh_V_count = -1;
    ngud->m_mesh_F_count = -1;

    const int ngon_count = ngud->m_ngon_list->V4V5_NgonCount();

    for ( i = 0; i < ngon_count; i++ )
    {
      if ( !ON_ValidateNgon(ngud->m_ngon_list->V4V5_Ngon(i),mesh_V_count,mesh_F_count) )
        return false;
    }

    // Set validation counts to proper values because we will 
    // assume this old ngon information is valid since the indices
    // are in range.  This assumption may not be valid, but
    // at least the ngon won't cause a crash.
    ngud->m_mesh_V_count = mesh_V_count;
    ngud->m_mesh_F_count = mesh_F_count;
  }

  return ( ngud->m_mesh_F_count == mesh_F_count && ngud->m_mesh_V_count == mesh_V_count );
}